

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

BOOL FlushViewOfFile(LPVOID lpBaseAddress,SIZE_T dwNumberOfBytesToFlush)

{
  int iVar1;
  CPalThread *pThread_00;
  PMAPPED_VIEW_LIST p_Var2;
  int *piVar3;
  uint local_34;
  BOOL fResult;
  PMAPPED_VIEW_LIST pView;
  CPalThread *pThread;
  SIZE_T SStack_18;
  PAL_ERROR palError;
  SIZE_T dwNumberOfBytesToFlush_local;
  LPVOID lpBaseAddress_local;
  
  pThread._4_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread_00,&mapping_critsec);
  p_Var2 = MAPGetViewForAddress(lpBaseAddress);
  if (p_Var2 == (PMAPPED_VIEW_LIST)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pThread._4_4_ = 6;
  }
  else {
    SStack_18 = dwNumberOfBytesToFlush;
    if (dwNumberOfBytesToFlush == 0) {
      SStack_18 = p_Var2->NumberOfBytesToMap;
    }
    iVar1 = msync(lpBaseAddress,SStack_18,4);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 == 0x16) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        piVar3 = __errno_location();
        strerror(*piVar3);
        pThread._4_4_ = 0x57;
      }
      else {
        piVar3 = __errno_location();
        if (*piVar3 == 5) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          piVar3 = __errno_location();
          strerror(*piVar3);
          pThread._4_4_ = 0x1d;
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          piVar3 = __errno_location();
          strerror(*piVar3);
          pThread._4_4_ = 0x54f;
        }
      }
    }
  }
  CorUnix::InternalLeaveCriticalSection(pThread_00,&mapping_critsec);
  if (pThread._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  local_34 = (uint)(pThread._4_4_ == 0);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return local_34;
  }
  abort();
}

Assistant:

BOOL
PALAPI
FlushViewOfFile(
    IN LPVOID lpBaseAddress,
    IN SIZE_T dwNumberOfBytesToFlush)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread = NULL;
    PMAPPED_VIEW_LIST pView = NULL;
    BOOL fResult = TRUE;

    PERF_ENTRY(FlushViewOfFile);
    ENTRY("FlushViewOfFile(lpBaseAddress=%p, dwNumberOfBytesToFlush=%u)\n",
          lpBaseAddress, dwNumberOfBytesToFlush);

    pThread = InternalGetCurrentThread();

    InternalEnterCriticalSection(pThread, &mapping_critsec);

    pView = MAPGetViewForAddress(lpBaseAddress);
    if (NULL == pView)
    {
        ERROR("lpBaseAddress has to be the address returned by MapViewOfFile[Ex]");
        palError = ERROR_INVALID_HANDLE;
        goto Exit;
    }

    if (dwNumberOfBytesToFlush == 0)
    {
        dwNumberOfBytesToFlush = pView->NumberOfBytesToMap;
    }

    // <ROTORTODO>we should only use MS_SYNC if the file has been opened
    // with FILE_FLAG_WRITE_THROUGH
    if (msync(lpBaseAddress, dwNumberOfBytesToFlush, MS_SYNC) == -1)
    {
        if (errno == EINVAL)
        {
            WARN("msync failed; %s\n", strerror(errno));
            palError = ERROR_INVALID_PARAMETER;
        }
        else if (errno == EIO)
        {
            WARN("msync failed; %s\n", strerror(errno));
            palError = ERROR_WRITE_FAULT;
        }
        else
        {
            ERROR("msync failed; %s\n", strerror(errno));
            palError = ERROR_INTERNAL_ERROR;
        }
    }

Exit:
    InternalLeaveCriticalSection(pThread, &mapping_critsec);

    if (NO_ERROR != palError)
    {
        fResult = FALSE;
        pThread->SetLastError(palError);
    }

    LOGEXIT("FlushViewOfFile returning %d.\n", fResult);
    PERF_EXIT(FlushViewOfFile);
    return fResult;
}